

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::generateVertices
               (vector<float,_std::allocator<float>_> *dst,float width,float height,
               int primitiveCount,int verticesPerPrimitive,Random *rnd,float primitiveSize,
               float minZ,float maxZ)

{
  pointer pfVar1;
  deRandom *rnd_00;
  undefined4 in_register_00000014;
  long lVar2;
  int iVar3;
  int iVar4;
  int i;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  rnd_00 = (deRandom *)CONCAT44(in_register_00000014,verticesPerPrimitive);
  fVar7 = width * 0.5;
  std::vector<float,_std::allocator<float>_>::resize(dst,(long)(primitiveCount * 0xc));
  iVar3 = 3;
  for (iVar5 = 0; iVar5 < primitiveCount * 3; iVar5 = iVar5 + 3) {
    fVar8 = deRandom_getFloat(rnd_00);
    fVar9 = deRandom_getFloat(rnd_00);
    lVar2 = 3;
    iVar4 = iVar3;
    while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
      fVar10 = deRandom_getFloat(rnd_00);
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar4 + -3] = fVar10 * (fVar7 + fVar7) + -fVar7 + fVar8 + fVar8 + -1.0;
      fVar10 = deRandom_getFloat(rnd_00);
      (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar4 + -2] = fVar10 * (fVar7 + fVar7) + -fVar7 + fVar9 + fVar9 + -1.0;
      fVar10 = deRandom_getFloat(rnd_00);
      pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1[iVar4 + -1] = fVar10 * (primitiveSize - height) + height;
      pfVar1[iVar4] = 1.0;
      iVar4 = iVar4 + 4;
    }
    iVar3 = iVar3 + 0xc;
  }
  return;
}

Assistant:

static void generateVertices (std::vector<float>& dst, float width, float height, int primitiveCount, int verticesPerPrimitive, de::Random rnd, float primitiveSize, float minZ, float maxZ)
{
	float w = width/2.0f;
	float h = height/2.0f;
	float s = primitiveSize/2.0f;

	int vertexCount = verticesPerPrimitive * primitiveCount;
	dst.resize(vertexCount * ELEMENTS_PER_VERTEX);

	for (int i = 0; i < vertexCount; i += 3)			// First loop gets a random point inside unit square
	{
		float rndX = rnd.getFloat(-w, w);
		float rndY = rnd.getFloat(-h, h);

		for (int j = 0; j < verticesPerPrimitive; j++)	// Second loop gets 3 random points within given distance s from (rndX, rndY)
		{
			dst[(i+j)*ELEMENTS_PER_VERTEX    ] = rndX + rnd.getFloat(-s,s);	// x
			dst[(i+j)*ELEMENTS_PER_VERTEX + 1] = rndY + rnd.getFloat(-s,s);	// y
			dst[(i+j)*ELEMENTS_PER_VERTEX + 2] = rnd.getFloat(minZ, maxZ);	// z
			dst[(i+j)*ELEMENTS_PER_VERTEX + 3] = 1.0f;						// w
		}
	}
}